

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::merge_or_update
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this,
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *source)

{
  json_storage_kind jVar1;
  json_storage_kind jVar2;
  object *source_00;
  undefined8 uVar3;
  json_runtime_error<std::domain_error,_void> *this_00;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RSI;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  string *in_stack_ffffffffffffff48;
  json_runtime_error<std::domain_error,_void> *in_stack_ffffffffffffff50;
  sorted_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
  *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined5 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffff97;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  jVar1 = storage_kind(in_RSI);
  if (jVar1 != empty_object) {
    if (jVar1 == json_reference) {
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
      cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff50);
      json_reference_storage::value((json_reference_storage *)0xaa4bca);
      merge_or_update(in_RSI,in_stack_ffffffffffffffe8);
    }
    else {
      if (jVar1 != object) {
        uVar4 = 1;
        this_00 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffff97,
                            CONCAT16(uVar4,CONCAT15(jVar1,in_stack_ffffffffffffff90))),
                   (char *)in_RDI,
                   (allocator<char> *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80))
        ;
        json_runtime_error<std::domain_error,_void>::json_runtime_error
                  (this_00,in_stack_ffffffffffffff48);
        __cxa_throw(this_00,&json_runtime_error<std::domain_error,void>::typeinfo,
                    json_runtime_error<std::domain_error,_void>::~json_runtime_error);
      }
      jVar2 = storage_kind(in_RDI);
      if (jVar2 == empty_object) {
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
        create_object_implicitly<std::allocator<char>>
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff50);
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
        cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage>
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff50);
        source_00 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage::
                    value_abi_cxx11_((object_storage *)
                                     CONCAT17(in_stack_ffffffffffffff97,
                                              CONCAT16(in_stack_ffffffffffffff96,
                                                       CONCAT15(jVar1,in_stack_ffffffffffffff90))));
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
        cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage>
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff50);
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage::
        value_abi_cxx11_((object_storage *)
                         CONCAT17(in_stack_ffffffffffffff97,
                                  CONCAT16(in_stack_ffffffffffffff96,
                                           CONCAT15(jVar1,in_stack_ffffffffffffff90))));
        sorted_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
        ::merge_or_update((sorted_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
                           *)CONCAT17(jVar2,in_stack_ffffffffffffff80),source_00);
      }
      else if (jVar2 == json_reference) {
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
        cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff50);
        json_reference_storage::value((json_reference_storage *)0xaa4ad6);
        merge_or_update(in_RSI,in_stack_ffffffffffffffe8);
      }
      else {
        if (jVar2 != object) {
          uVar3 = __cxa_allocate_exception(0x18);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffff97,
                              CONCAT16(in_stack_ffffffffffffff96,
                                       CONCAT15(jVar1,in_stack_ffffffffffffff90))),(char *)in_RDI,
                     (allocator<char> *)CONCAT17(jVar2,in_stack_ffffffffffffff80));
          json_runtime_error<std::domain_error,_void>::json_runtime_error
                    (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          __cxa_throw(uVar3,&json_runtime_error<std::domain_error,void>::typeinfo,
                      json_runtime_error<std::domain_error,_void>::~json_runtime_error);
        }
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
        cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage>
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff50);
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage::
        value_abi_cxx11_((object_storage *)
                         CONCAT17(in_stack_ffffffffffffff97,
                                  CONCAT16(in_stack_ffffffffffffff96,
                                           CONCAT15(jVar1,in_stack_ffffffffffffff90))));
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
        cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage>
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff50);
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage::
        value_abi_cxx11_((object_storage *)
                         CONCAT17(in_stack_ffffffffffffff97,
                                  CONCAT16(in_stack_ffffffffffffff96,
                                           CONCAT15(jVar1,in_stack_ffffffffffffff90))));
        sorted_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
        ::merge_or_update((sorted_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
                           *)CONCAT17(jVar2,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78);
      }
    }
  }
  return;
}

Assistant:

void merge_or_update(const basic_json& source)
        {
            switch (source.storage_kind())
            {
                case json_storage_kind::empty_object:
                    break;
                case json_storage_kind::object:
                    switch (storage_kind())
                    {
                        case json_storage_kind::empty_object:
                            create_object_implicitly();
                            cast<object_storage>().value().merge_or_update(source.cast<object_storage>().value());
                            break;
                        case json_storage_kind::object:
                            cast<object_storage>().value().merge_or_update(source.cast<object_storage>().value());
                            break;
                        case json_storage_kind::json_reference:
                            cast<json_reference_storage>().value().merge_or_update(source);
                            break;
                        default:
                            JSONCONS_THROW(json_runtime_error<std::domain_error>("Attempting to merge or update a value that is not an object"));
                    }
                    break;
                case json_storage_kind::json_reference:
                    merge_or_update(source.cast<json_reference_storage>().value());
                    break;
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Attempting to merge a value that is not an object"));
            }
        }